

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

locale __thiscall
booster::locale::impl_icu::install_parsing_facets<char>(impl_icu *this,locale *in,cdata *cd)

{
  bool bVar1;
  num_parse<char> *this_00;
  icu_formatters_cache *this_01;
  locale lStack_28;
  
  this_00 = (num_parse<char> *)operator_new(0x110);
  num_parse<char>::num_parse(this_00,cd,0);
  std::locale::locale<booster::locale::impl_icu::num_parse<char>>((locale *)this,in,this_00);
  bVar1 = std::has_facet<booster::locale::impl_icu::icu_formatters_cache>(in);
  if (!bVar1) {
    this_01 = (icu_formatters_cache *)operator_new(0x730);
    icu_formatters_cache::icu_formatters_cache(this_01,&cd->locale);
    std::locale::locale<booster::locale::impl_icu::icu_formatters_cache>
              (&lStack_28,(locale *)this,this_01);
    std::locale::operator=((locale *)this,&lStack_28);
    std::locale::~locale(&lStack_28);
  }
  return (locale)(_Impl *)this;
}

Assistant:

std::locale install_parsing_facets(std::locale const &in,cdata const &cd)
{
    std::locale tmp=std::locale(in,new num_parse<CharType>(cd));
    if(!std::has_facet<icu_formatters_cache>(in)) {
        tmp=std::locale(tmp,new icu_formatters_cache(cd.locale)); 
    }
    return tmp;
}